

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhsts.cpp
# Opt level: O0

void __thiscall QHstsCache::updateFromPolicies(QHstsCache *this,QList<QHstsPolicy> *policies)

{
  bool bVar1;
  QHstsPolicy *this_00;
  qsizetype qVar2;
  QHstsStore *in_RSI;
  QHstsCache *in_RDI;
  long in_FS_OFFSET;
  QHstsPolicy *policy;
  QList<QHstsPolicy> *__range1;
  const_iterator __end1;
  const_iterator __begin1;
  undefined1 includeSubDomains;
  QHstsStore *this_01;
  QHstsCache *this_02;
  QDateTime local_48 [40];
  QHstsPolicy *local_20;
  const_iterator local_18;
  const_iterator local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10.i = (QHstsPolicy *)0xaaaaaaaaaaaaaaaa;
  this_01 = in_RSI;
  this_02 = in_RDI;
  local_10 = QList<QHstsPolicy>::begin((QList<QHstsPolicy> *)in_RDI);
  local_18.i = (QHstsPolicy *)0xaaaaaaaaaaaaaaaa;
  local_18 = QList<QHstsPolicy>::end((QList<QHstsPolicy> *)in_RDI);
  while( true ) {
    local_20 = local_18.i;
    bVar1 = QList<QHstsPolicy>::const_iterator::operator!=(&local_10,local_18);
    if (!bVar1) break;
    this_00 = QList<QHstsPolicy>::const_iterator::operator*(&local_10);
    QFlags<QUrl::ComponentFormattingOption>::QFlags
              ((QFlags<QUrl::ComponentFormattingOption> *)in_RDI,
               (ComponentFormattingOption)((ulong)this_00 >> 0x20));
    QHstsPolicy::host(this_00,(QFlagsStorageHelper<QUrl::ComponentFormattingOption,_4>)
                              SUB84((ulong)this_01 >> 0x20,0));
    QHstsPolicy::expiry(this_00);
    includeSubDomains = (undefined1)((ulong)this_00 >> 0x38);
    QHstsPolicy::includesSubDomains((QHstsPolicy *)0x17981c);
    updateKnownHost(this_02,(QString *)this_01,(QDateTime *)in_RSI,(bool)includeSubDomains);
    QDateTime::~QDateTime(local_48);
    QString::~QString((QString *)0x17984a);
    QList<QHstsPolicy>::const_iterator::operator++(&local_10);
  }
  if (in_RDI->hstsStore != (QHstsStore *)0x0) {
    qVar2 = QList<QHstsPolicy>::size(&this_01->observedPolicies);
    if (qVar2 != 0) {
      QHstsStore::synchronize(this_01);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QHstsCache::updateFromPolicies(const QList<QHstsPolicy> &policies)
{
    for (const auto &policy : policies)
        updateKnownHost(policy.host(), policy.expiry(), policy.includesSubDomains());

#if QT_CONFIG(settings)
    if (hstsStore && policies.size()) {
        // These policies are coming either from store or from QNAM's setter
        // function. As a result we can notice expired or new policies, time
        // to sync ...
        hstsStore->synchronize();
    }
#endif // QT_CONFIG(settings)
}